

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantities_testing_kernels.h
# Opt level: O0

void Quantities_solve(Quantities *quan,P *vslocal,int ia,int iaind,int iamax,P *facexy,P *facexz,
                     P *faceyz,int ix_b,int iy_b,int iz_b,int ie,int ix_g,int iy_g,int iz_g,
                     int octant,int octant_in_block,int noctant_per_block,Dimensions dims_b,
                     Dimensions dims_g,Bool_t is_cell_active)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  P *pPVar9;
  P *pPVar10;
  P PVar11;
  P PVar12;
  P PVar13;
  double dVar14;
  P result_scaled;
  P result;
  P *vslocal_this;
  P scalefactor_space_z_r;
  P scalefactor_space_y_r;
  P scalefactor_space_x_r;
  P scalefactor_space_r;
  P scalefactor_space;
  P scalefactor_octant_r;
  P scalefactor_octant;
  int iu;
  int dir_z;
  int dir_y;
  int dir_x;
  P *facexy_local;
  int iamax_local;
  int iaind_local;
  int ia_local;
  P *vslocal_local;
  Quantities *quan_local;
  
  if (vslocal == (P *)0x0) {
    __assert_fail("vslocal",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                  ,0x168,
                  "void Quantities_solve(const Quantities *const, P *const restrict, const int, const int, const int, P *const restrict, P *const restrict, P *const restrict, const int, const int, const int, const int, const int, const int, const int, const int, const int, const int, const Dimensions, const Dimensions, const Bool_t)"
                 );
  }
  if (ia < 0) {
    __assert_fail("ia >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                  ,0x16c,
                  "void Quantities_solve(const Quantities *const, P *const restrict, const int, const int, const int, P *const restrict, P *const restrict, P *const restrict, const int, const int, const int, const int, const int, const int, const int, const int, const int, const int, const Dimensions, const Dimensions, const Bool_t)"
                 );
  }
  if ((iaind < 0) || (iamax <= iaind)) {
    __assert_fail("iaind >= 0 && iaind < iamax",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                  ,0x16d,
                  "void Quantities_solve(const Quantities *const, P *const restrict, const int, const int, const int, P *const restrict, P *const restrict, P *const restrict, const int, const int, const int, const int, const int, const int, const int, const int, const int, const int, const Dimensions, const Dimensions, const Bool_t)"
                 );
  }
  if (iamax < 0) {
    __assert_fail("iamax >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                  ,0x16e,
                  "void Quantities_solve(const Quantities *const, P *const restrict, const int, const int, const int, P *const restrict, P *const restrict, P *const restrict, const int, const int, const int, const int, const int, const int, const int, const int, const int, const int, const Dimensions, const Dimensions, const Bool_t)"
                 );
  }
  if (facexy == (P *)0x0) {
    __assert_fail("facexy",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                  ,0x16f,
                  "void Quantities_solve(const Quantities *const, P *const restrict, const int, const int, const int, P *const restrict, P *const restrict, P *const restrict, const int, const int, const int, const int, const int, const int, const int, const int, const int, const int, const Dimensions, const Dimensions, const Bool_t)"
                 );
  }
  if (facexz == (P *)0x0) {
    __assert_fail("facexz",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                  ,0x170,
                  "void Quantities_solve(const Quantities *const, P *const restrict, const int, const int, const int, P *const restrict, P *const restrict, P *const restrict, const int, const int, const int, const int, const int, const int, const int, const int, const int, const int, const Dimensions, const Dimensions, const Bool_t)"
                 );
  }
  if (faceyz == (P *)0x0) {
    __assert_fail("faceyz",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                  ,0x171,
                  "void Quantities_solve(const Quantities *const, P *const restrict, const int, const int, const int, P *const restrict, P *const restrict, P *const restrict, const int, const int, const int, const int, const int, const int, const int, const int, const int, const int, const Dimensions, const Dimensions, const Bool_t)"
                 );
  }
  if (((ix_b < 0) || (dims_b.ncell_x <= ix_b)) && (is_cell_active != 0)) {
    __assert_fail("( ix_b >= 0 && ix_b < dims_b.ncell_x ) || ! is_cell_active",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                  ,0x172,
                  "void Quantities_solve(const Quantities *const, P *const restrict, const int, const int, const int, P *const restrict, P *const restrict, P *const restrict, const int, const int, const int, const int, const int, const int, const int, const int, const int, const int, const Dimensions, const Dimensions, const Bool_t)"
                 );
  }
  if (((iy_b < 0) || (dims_b.ncell_y <= iy_b)) && (is_cell_active != 0)) {
    __assert_fail("( iy_b >= 0 && iy_b < dims_b.ncell_y ) || ! is_cell_active",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                  ,0x173,
                  "void Quantities_solve(const Quantities *const, P *const restrict, const int, const int, const int, P *const restrict, P *const restrict, P *const restrict, const int, const int, const int, const int, const int, const int, const int, const int, const int, const int, const Dimensions, const Dimensions, const Bool_t)"
                 );
  }
  if (((iz_b < 0) || (dims_b.ncell_z <= iz_b)) && (is_cell_active != 0)) {
    __assert_fail("( iz_b >= 0 && iz_b < dims_b.ncell_z ) || ! is_cell_active",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                  ,0x174,
                  "void Quantities_solve(const Quantities *const, P *const restrict, const int, const int, const int, P *const restrict, P *const restrict, P *const restrict, const int, const int, const int, const int, const int, const int, const int, const int, const int, const int, const Dimensions, const Dimensions, const Bool_t)"
                 );
  }
  if (((ix_g < 0) || (dims_g.ncell_x <= ix_g)) && (is_cell_active != 0)) {
    __assert_fail("( ix_g >= 0 && ix_g < dims_g.ncell_x ) || ! is_cell_active",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                  ,0x175,
                  "void Quantities_solve(const Quantities *const, P *const restrict, const int, const int, const int, P *const restrict, P *const restrict, P *const restrict, const int, const int, const int, const int, const int, const int, const int, const int, const int, const int, const Dimensions, const Dimensions, const Bool_t)"
                 );
  }
  if (((iy_g < 0) || (dims_g.ncell_y <= iy_g)) && (is_cell_active != 0)) {
    __assert_fail("( iy_g >= 0 && iy_g < dims_g.ncell_y ) || ! is_cell_active",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                  ,0x176,
                  "void Quantities_solve(const Quantities *const, P *const restrict, const int, const int, const int, P *const restrict, P *const restrict, P *const restrict, const int, const int, const int, const int, const int, const int, const int, const int, const int, const int, const Dimensions, const Dimensions, const Bool_t)"
                 );
  }
  if (((iz_g < 0) || (dims_g.ncell_z <= iz_g)) && (is_cell_active != 0)) {
    __assert_fail("( iz_g >= 0 && iz_g < dims_g.ncell_z ) || ! is_cell_active",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                  ,0x177,
                  "void Quantities_solve(const Quantities *const, P *const restrict, const int, const int, const int, P *const restrict, P *const restrict, P *const restrict, const int, const int, const int, const int, const int, const int, const int, const int, const int, const int, const Dimensions, const Dimensions, const Bool_t)"
                 );
  }
  if ((ie < 0) || (dims_b.ne <= ie)) {
    __assert_fail("ie >= 0 && ie < dims_b.ne",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                  ,0x178,
                  "void Quantities_solve(const Quantities *const, P *const restrict, const int, const int, const int, P *const restrict, P *const restrict, P *const restrict, const int, const int, const int, const int, const int, const int, const int, const int, const int, const int, const Dimensions, const Dimensions, const Bool_t)"
                 );
  }
  if ((-1 < octant) && (octant < 8)) {
    if ((-1 < octant_in_block) && (octant_in_block < noctant_per_block)) {
      if ((ia < dims_b.na) && (is_cell_active != 0)) {
        iVar4 = Dir_x(octant);
        iVar5 = Dir_y(octant);
        iVar6 = Dir_z(octant);
        iVar7 = Quantities_scalefactor_octant_(octant);
        iVar8 = Quantities_scalefactor_space_(quan,ix_g,iy_g,iz_g);
        iVar4 = Dir_inc(iVar4);
        iVar4 = Quantities_scalefactor_space_(quan,ix_g - iVar4,iy_g,iz_g);
        iVar5 = Dir_inc(iVar5);
        iVar5 = Quantities_scalefactor_space_(quan,ix_g,iy_g - iVar5,iz_g);
        iVar6 = Dir_inc(iVar6);
        iVar6 = Quantities_scalefactor_space_(quan,ix_g,iy_g,iz_g - iVar6);
        for (scalefactor_octant._0_4_ = 0; scalefactor_octant._0_4_ < 4;
            scalefactor_octant._0_4_ = scalefactor_octant._0_4_ + 1) {
          pPVar9 = ref_vslocal(vslocal,dims_b,4,iamax,iaind,scalefactor_octant._0_4_);
          dVar14 = *pPVar9;
          pPVar10 = const_ref_facexy(facexy,dims_b,4,noctant_per_block,ix_b,iy_b,ie,ia,
                                     scalefactor_octant._0_4_,octant_in_block);
          dVar1 = *pPVar10;
          PVar11 = Quantities_xfluxweight_(dims_g,ia);
          pPVar10 = const_ref_facexz(facexz,dims_b,4,noctant_per_block,ix_b,iz_b,ie,ia,
                                     scalefactor_octant._0_4_,octant_in_block);
          dVar2 = *pPVar10;
          PVar12 = Quantities_yfluxweight_(dims_g,ia);
          pPVar10 = const_ref_faceyz(faceyz,dims_b,4,noctant_per_block,iy_b,iz_b,ie,ia,
                                     scalefactor_octant._0_4_,octant_in_block);
          dVar3 = *pPVar10;
          PVar13 = Quantities_zfluxweight_(dims_g,ia);
          dVar14 = (dVar14 * (1.0 / (double)iVar8) +
                   (dVar3 * PVar13 * (1.0 / (double)iVar4) +
                   dVar1 * PVar11 * (1.0 / (double)iVar6) + dVar2 * PVar12 * (1.0 / (double)iVar5))
                   * (1.0 / (double)iVar7)) * (double)iVar8;
          *pPVar9 = dVar14;
          dVar14 = dVar14 * (double)iVar7;
          pPVar9 = ref_facexy(facexy,dims_b,4,noctant_per_block,ix_b,iy_b,ie,ia,
                              scalefactor_octant._0_4_,octant_in_block);
          *pPVar9 = dVar14;
          pPVar9 = ref_facexz(facexz,dims_b,4,noctant_per_block,ix_b,iz_b,ie,ia,
                              scalefactor_octant._0_4_,octant_in_block);
          *pPVar9 = dVar14;
          pPVar9 = ref_faceyz(faceyz,dims_b,4,noctant_per_block,iy_b,iz_b,ie,ia,
                              scalefactor_octant._0_4_,octant_in_block);
          *pPVar9 = dVar14;
        }
      }
      return;
    }
    __assert_fail("octant_in_block >= 0 && octant_in_block < noctant_per_block",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                  ,0x17a,
                  "void Quantities_solve(const Quantities *const, P *const restrict, const int, const int, const int, P *const restrict, P *const restrict, P *const restrict, const int, const int, const int, const int, const int, const int, const int, const int, const int, const int, const Dimensions, const Dimensions, const Bool_t)"
                 );
  }
  __assert_fail("octant >= 0 && octant < NOCTANT",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wdj[P]minisweep/src/3_sweeper/quantities_testing_kernels.h"
                ,0x179,
                "void Quantities_solve(const Quantities *const, P *const restrict, const int, const int, const int, P *const restrict, P *const restrict, P *const restrict, const int, const int, const int, const int, const int, const int, const int, const int, const int, const int, const Dimensions, const Dimensions, const Bool_t)"
               );
}

Assistant:

TARGET_HD static inline void Quantities_solve(
  const Quantities* const  quan,
  P* const __restrict__ vslocal,
  const int             ia,
  const int             iaind,
  const int             iamax,
  P* const __restrict__ facexy,
  P* const __restrict__ facexz,
  P* const __restrict__ faceyz,
  const int             ix_b,
  const int             iy_b,
  const int             iz_b,
  const int             ie,
  const int             ix_g,
  const int             iy_g,
  const int             iz_g,
  const int             octant,
  const int             octant_in_block,
  const int             noctant_per_block,
  const Dimensions      dims_b,
  const Dimensions      dims_g,
  const Bool_t          is_cell_active )
{
  Assert( vslocal );
  /*
  Assert( ia >= 0 && ia < dims_b.na );
  */
  Assert( ia >= 0 );
  Assert( iaind >= 0 && iaind < iamax );
  Assert( iamax >= 0 );
  Assert( facexy );
  Assert( facexz );
  Assert( faceyz );
  Assert( ( ix_b >= 0 && ix_b < dims_b.ncell_x ) || ! is_cell_active );
  Assert( ( iy_b >= 0 && iy_b < dims_b.ncell_y ) || ! is_cell_active );
  Assert( ( iz_b >= 0 && iz_b < dims_b.ncell_z ) || ! is_cell_active );
  Assert( ( ix_g >= 0 && ix_g < dims_g.ncell_x ) || ! is_cell_active );
  Assert( ( iy_g >= 0 && iy_g < dims_g.ncell_y ) || ! is_cell_active );
  Assert( ( iz_g >= 0 && iz_g < dims_g.ncell_z ) || ! is_cell_active );
  Assert( ie   >= 0 && ie   < dims_b.ne );
  Assert( octant >= 0 && octant < NOCTANT );
  Assert( octant_in_block >= 0 && octant_in_block < noctant_per_block );

  if( ia < dims_b.na && is_cell_active )
  {
    const int dir_x = Dir_x( octant );
    const int dir_y = Dir_y( octant );
    const int dir_z = Dir_z( octant );

    int iu = 0;

    /*---Average the face values and accumulate---*/

    /*---The state value and incoming face values are first adjusted to
         normalized values by removing the spatial scaling.
         They are then combined using a weighted average chosen in a special
         way to give just the expected result.
         Finally, spatial scaling is applied to the result which is then
         stored.
    ---*/

    const P scalefactor_octant = Quantities_scalefactor_octant_( octant );
    const P scalefactor_octant_r = ((P)1) / scalefactor_octant;
    const P scalefactor_space
                    = Quantities_scalefactor_space_( quan, ix_g, iy_g, iz_g );
    const P scalefactor_space_r = ((P)1) / scalefactor_space;
    const P scalefactor_space_x_r = ((P)1) /
       Quantities_scalefactor_space_( quan, ix_g-Dir_inc(dir_x), iy_g, iz_g );
    const P scalefactor_space_y_r = ((P)1) /
       Quantities_scalefactor_space_( quan, ix_g, iy_g-Dir_inc(dir_y), iz_g );
    const P scalefactor_space_z_r = ((P)1) /
       Quantities_scalefactor_space_( quan, ix_g, iy_g, iz_g-Dir_inc(dir_z) );

#pragma unroll
    for( iu=0; iu<NU; ++iu )
    {
      P* const __restrict__ vslocal_this
                        = ref_vslocal( vslocal, dims_b, NU, iamax, iaind, iu );
/*
      P* const __restrict__ facexy_this
                        = ref_facexy( facexy, dims_b, NU, noctant_per_block,
                                      ix_b, iy_b, ie, ia, iu, octant_in_block );
*/

      const P result = ( *vslocal_this * scalefactor_space_r + (
          *const_ref_facexy( facexy, dims_b, NU, noctant_per_block,
                                     ix_b, iy_b, ie, ia, iu, octant_in_block )
           * Quantities_xfluxweight_( dims_g, ia )
           * scalefactor_space_z_r
        + *const_ref_facexz( facexz, dims_b, NU, noctant_per_block,
                                     ix_b, iz_b, ie, ia, iu, octant_in_block )
           * Quantities_yfluxweight_( dims_g, ia )
           * scalefactor_space_y_r
        + *const_ref_faceyz( faceyz, dims_b, NU, noctant_per_block,
                                     iy_b, iz_b, ie, ia, iu, octant_in_block )
           * Quantities_zfluxweight_( dims_g, ia )
           * scalefactor_space_x_r
      ) * scalefactor_octant_r ) * scalefactor_space;

      *vslocal_this = result;
      const P result_scaled = result * scalefactor_octant;
      *ref_facexy( facexy, dims_b, NU, noctant_per_block,
                   ix_b, iy_b, ie, ia, iu, octant_in_block ) = result_scaled;
      *ref_facexz( facexz, dims_b, NU, noctant_per_block,
                   ix_b, iz_b, ie, ia, iu, octant_in_block ) = result_scaled;
      *ref_faceyz( faceyz, dims_b, NU, noctant_per_block,
                   iy_b, iz_b, ie, ia, iu, octant_in_block ) = result_scaled;
    } /*---for---*/

  }
}